

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O2

QueryResult * __thiscall
OnDiskIndex::query(QueryResult *__return_storage_ptr__,OnDiskIndex *this,TriGram trigram,
                  QueryCounters *counters)

{
  SortedRun local_40;
  
  query_primitive(&local_40,this,trigram,&counters->reads_);
  QueryResult::QueryResult(__return_storage_ptr__,&local_40);
  SortedRun::~SortedRun(&local_40);
  return __return_storage_ptr__;
}

Assistant:

QueryResult OnDiskIndex::query(TriGram trigram, QueryCounters *counters) const {
    return QueryResult(std::move(query_primitive(trigram, &counters->reads())));
}